

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu541_common.c
# Opt level: O2

MPP_RET vepu541_set_roi(void *buf,MppEncROICfg *roi,RK_S32 w,RK_S32 h)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  char *fmt;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  RK_U8 *pRVar8;
  MppEncROIRegion *pMVar9;
  int iVar10;
  
  uVar7 = (ulong)(uint)h;
  if (roi == (MppEncROICfg *)0x0 || buf == (void *)0x0) {
    _mpp_log_l(2,"vepu541_common","invalid buf %p roi %p\n","vepu541_set_roi",buf);
  }
  else {
    uVar5 = (ulong)(uint)w;
    pMVar9 = roi->regions;
    uVar1 = ((w + 0xf >> 4) + 3U & 0xfffffffc) * ((h + 0xf >> 4) + 3U & 0x3ffffffc);
    uVar4 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    for (; (int)uVar3 != (int)uVar4; uVar4 = uVar4 + 1) {
      *(undefined2 *)((long)buf + uVar4 * 2) = 0x80;
    }
    if (w < 1 || h < 1) {
      fmt = "invalid size [%d:%d]\n";
LAB_00254ba1:
      _mpp_log_l(2,"vepu541_common",fmt,"vepu541_set_roi",uVar5,uVar7);
    }
    else {
      uVar1 = roi->number;
      if (uVar1 < 9) {
        pRVar8 = &pMVar9->abs_qp_en;
        uVar2 = 0;
        do {
          if (uVar1 == uVar2) {
            pMVar9 = roi->regions;
            for (iVar10 = 0; iVar10 < (int)uVar1; iVar10 = iVar10 + 1) {
              vepu541_set_one_roi(buf,pMVar9,w,h);
              pMVar9 = pMVar9 + 1;
              uVar1 = roi->number;
            }
            return MPP_OK;
          }
          if ((w < (int)((uint)*(ushort *)(pRVar8 + -0xb) +
                        (uint)((MppEncROIRegion *)(pRVar8 + -0xf))->x)) ||
             (iVar10 = 0,
             h < (int)((uint)*(ushort *)(pRVar8 + -9) + (uint)*(ushort *)(pRVar8 + -0xd)))) {
            iVar10 = -1;
          }
          if ((((1 < *(ushort *)(pRVar8 + -7)) || (7 < *(ushort *)(pRVar8 + -3))) ||
              (1 < pRVar8[-1])) || (bVar6 = *pRVar8, 1 < bVar6)) {
            bVar6 = *pRVar8;
            iVar10 = -1;
          }
          if (bVar6 == 0) {
            if ((iVar10 != 0) || (0x66 < (ushort)(*(short *)(pRVar8 + -5) + 0x33U))) {
LAB_00254ca7:
              _mpp_log_l(2,"vepu541_common","region %d invalid param:\n","vepu541_set_roi",
                         (ulong)uVar2);
              _mpp_log_l(2,"vepu541_common","position [%d:%d:%d:%d] vs [%d:%d]\n","vepu541_set_roi",
                         (ulong)((MppEncROIRegion *)(pRVar8 + -0xf))->x,
                         (ulong)*(ushort *)(pRVar8 + -0xd),(ulong)*(ushort *)(pRVar8 + -0xb),
                         (ulong)*(ushort *)(pRVar8 + -9),uVar5,uVar7);
              _mpp_log_l(2,"vepu541_common","force intra %d qp area index %d\n","vepu541_set_roi",
                         (ulong)*(ushort *)(pRVar8 + -7),(ulong)*(ushort *)(pRVar8 + -3));
              uVar5 = (ulong)*pRVar8;
              uVar7 = (ulong)(uint)(int)*(short *)(pRVar8 + -5);
              fmt = "abs qp mode %d value %d\n";
              goto LAB_00254ba1;
            }
          }
          else if ((iVar10 != 0) || (0x33 < *(short *)(pRVar8 + -5))) goto LAB_00254ca7;
          uVar2 = uVar2 + 1;
          pRVar8 = pRVar8 + 0x10;
        } while( true );
      }
      _mpp_log_l(2,"vepu541_common","invalid region number %d\n","vepu541_set_roi");
    }
  }
  return MPP_NOK;
}

Assistant:

MPP_RET vepu541_set_roi(void *buf, MppEncROICfg *roi, RK_S32 w, RK_S32 h)
{
    MppEncROIRegion *region = roi->regions;
    Vepu541RoiCfg *ptr = (Vepu541RoiCfg *)buf;
    RK_S32 mb_w = MPP_ALIGN(w, 16) / 16;
    RK_S32 mb_h = MPP_ALIGN(h, 16) / 16;
    RK_S32 stride_h = MPP_ALIGN(mb_w, 4);
    RK_S32 stride_v = MPP_ALIGN(mb_h, 4);
    Vepu541RoiCfg cfg;
    MPP_RET ret = MPP_NOK;
    RK_S32 i;

    if (NULL == buf || NULL == roi) {
        mpp_err_f("invalid buf %p roi %p\n", buf, roi);
        goto DONE;
    }

    cfg.force_intra = 0;
    cfg.reserved    = 0;
    cfg.qp_area_idx = 0;
    cfg.qp_area_en  = 1;
    cfg.qp_adj      = 0;
    cfg.qp_adj_mode = 0;

    /* step 1. reset all the config */
    for (i = 0; i < stride_h * stride_v; i++, ptr++)
        memcpy(ptr, &cfg, sizeof(cfg));

    if (w <= 0 || h <= 0) {
        mpp_err_f("invalid size [%d:%d]\n", w, h);
        goto DONE;
    }

    if (roi->number > VEPU541_MAX_ROI_NUM) {
        mpp_err_f("invalid region number %d\n", roi->number);
        goto DONE;
    }

    /* check region config */
    ret = MPP_OK;
    for (i = 0; i < (RK_S32)roi->number; i++, region++) {
        if (region->x + region->w > w || region->y + region->h > h)
            ret = MPP_NOK;

        if (region->intra > 1 || region->qp_area_idx >= VEPU541_MAX_ROI_NUM ||
            region->area_map_en > 1 || region->abs_qp_en > 1)
            ret = MPP_NOK;

        if ((region->abs_qp_en && region->quality > 51) ||
            (!region->abs_qp_en && (region->quality > 51 || region->quality < -51)))
            ret = MPP_NOK;

        if (ret) {
            mpp_err_f("region %d invalid param:\n", i);
            mpp_err_f("position [%d:%d:%d:%d] vs [%d:%d]\n",
                      region->x, region->y, region->w, region->h, w, h);
            mpp_err_f("force intra %d qp area index %d\n",
                      region->intra, region->qp_area_idx);
            mpp_err_f("abs qp mode %d value %d\n",
                      region->abs_qp_en, region->quality);
            goto DONE;
        }
    }

    region = roi->regions;
    /* step 2. setup region for top to bottom */
    for (i = 0; i < (RK_S32)roi->number; i++, region++) {
        vepu541_set_one_roi(buf, region, w, h);
    }

DONE:
    return ret;
}